

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_boundary.c
# Opt level: O0

int iterBoundaryAdvance(mpt_iterator *it)

{
  int iVar1;
  mpt_iteratorBoundary *d;
  mpt_iterator *it_local;
  
  if (*(uint *)((long)&it[6]._vptr + 4) < *(uint *)&it[6]._vptr) {
    iVar1 = *(int *)((long)&it[6]._vptr + 4) + 1;
    *(int *)((long)&it[6]._vptr + 4) = iVar1;
    if (iVar1 == *(int *)&it[6]._vptr) {
      it_local._4_4_ = 0;
    }
    else {
      it_local._4_4_ = 100;
    }
  }
  else {
    it_local._4_4_ = -0x10;
  }
  return it_local._4_4_;
}

Assistant:

static int iterBoundaryAdvance(MPT_INTERFACE(iterator) *it)
{
	MPT_STRUCT(iteratorBoundary) *d = MPT_baseaddr(iteratorBoundary, it, _it);
	if (d->pos >= d->elem) {
		return MPT_ERROR(MissingData);
	}
	if (++d->pos == d->elem) {
		return 0;
	}
	return 'd';
}